

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeCallIndirect
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name table,HeapType type,
          bool isReturn)

{
  size_t size;
  CallIndirect *expr;
  Expression local_e8;
  uintptr_t local_d8;
  ArenaVector<wasm::Expression_*> local_d0;
  Expression *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  string local_90 [32];
  undefined1 local_70 [8];
  Result<wasm::Ok> _val;
  HeapType type_local;
  
  local_d0.allocator = &this->wasm->allocator;
  local_e8._id = CallIndirectId;
  local_e8.type.id = 0;
  local_d0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  local_d0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements =
       0;
  local_d0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  local_d8 = type.id;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = type.id;
  _local_70 = (undefined1  [16])
              HeapType::getSignature
                        ((HeapType *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  size = wasm::Type::size((Type *)local_70);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            (&local_d0.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             size);
  visitExpression((Result<wasm::Ok> *)local_70,this,&local_e8);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string(local_90,(string *)local_70);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_90);
    std::__cxx11::string::~string(local_90);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_70);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_70);
    expr = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                     (&this->builder,table,local_b0,&local_d0,
                      (HeapType)
                      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,isReturn);
    push(this,(Expression *)expr);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeCallIndirect(Name table, HeapType type, bool isReturn) {
  CallIndirect curr(wasm.allocator);
  curr.heapType = type;
  curr.operands.resize(type.getSignature().params.size());
  CHECK_ERR(visitCallIndirect(&curr));
  push(builder.makeCallIndirect(
    table, curr.target, curr.operands, type, isReturn));
  return Ok{};
}